

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O2

Vec_Int_t * Sdb_StoFindInputs(Vec_Wec_t *vCuts,int Front)

{
  uint nCap;
  int iVar1;
  int iVar2;
  Vec_Int_t *vVec1;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p_01;
  int Addition;
  int Entry;
  int Entry_00;
  int Entry_01;
  int Entry_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  undefined8 extraout_RDX_02;
  int iVar5;
  int iVar6;
  int iVar7;
  
  vVec1 = Vec_IntAlloc(100);
  p = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(100);
  iVar7 = 0;
  for (iVar6 = 0; iVar6 < vCuts->nSize; iVar6 = iVar6 + 1) {
    pVVar3 = Vec_WecEntry(vCuts,iVar6);
    for (iVar5 = 0; iVar5 < pVVar3->nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(pVVar3,iVar5);
      if (iVar7 <= iVar1) {
        iVar7 = iVar1;
      }
    }
  }
  nCap = iVar7 + 1;
  pVVar3 = Vec_IntAlloc(nCap);
  pVVar3->nSize = nCap;
  uVar4 = extraout_RDX;
  if (pVVar3->pArray != (int *)0x0) {
    memset(pVVar3->pArray,0,(ulong)nCap << 2);
    uVar4 = extraout_RDX_00;
  }
  for (iVar6 = 0; iVar6 < vCuts->nSize; iVar6 = iVar6 + 1) {
    p_01 = Vec_WecEntry(vCuts,iVar6);
    uVar4 = extraout_RDX_01;
    for (iVar5 = 0; iVar5 < p_01->nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(p_01,iVar5);
      Vec_IntAddToEntry(pVVar3,iVar1,Addition);
      uVar4 = extraout_RDX_02;
    }
  }
  Vec_IntWriteEntry(pVVar3,0,(int)uVar4);
  iVar6 = 1000000000;
  for (iVar5 = 0; iVar5 <= iVar7; iVar5 = iVar5 + 1) {
    iVar2 = Vec_IntEntry(pVVar3,iVar5);
    iVar1 = iVar2;
    if (iVar6 < iVar2) {
      iVar1 = iVar6;
    }
    if (iVar2 != 0) {
      iVar6 = iVar1;
    }
  }
  if (iVar6 != 1000000000) {
    iVar5 = Vec_IntFind(pVVar3,iVar6);
    Vec_IntPush(p,iVar5);
    Vec_IntWriteEntry(pVVar3,iVar5,Entry);
    for (iVar5 = 0; iVar5 <= iVar7; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(pVVar3,iVar5);
      if ((iVar1 == iVar6) || (iVar1 == iVar6 * 2)) {
        Vec_IntPush(p,iVar5);
        Vec_IntWriteEntry(pVVar3,iVar5,Entry_00);
      }
    }
    iVar6 = Vec_IntEntry(pVVar3,Front);
    Vec_IntPush(p_00,Front);
    Vec_IntWriteEntry(pVVar3,Front,Entry_01);
    for (iVar5 = 0; iVar5 <= iVar7; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(pVVar3,iVar5);
      if (iVar1 == iVar6 * 2 || iVar1 == iVar6) {
        Vec_IntPush(p_00,iVar5);
        Vec_IntWriteEntry(pVVar3,iVar5,Entry_02);
      }
    }
    Vec_IntFree(pVVar3);
    Vec_IntPrint(p);
    Vec_IntPrint(p_00);
    Vec_IntAppend(vVec1,p);
    Vec_IntAppend(vVec1,p_00);
    Vec_IntFree(p);
    Vec_IntFree(p_00);
  }
  return vVec1;
}

Assistant:

Vec_Int_t * Sdb_StoFindInputs( Vec_Wec_t * vCuts, int Front )
{
    int fVerbose = 0;
    Vec_Int_t * vCut, * vCounts;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vResA = Vec_IntAlloc( 100 );
    Vec_Int_t * vResB = Vec_IntAlloc( 100 );
    int i, k, Entry, Max = 0, Min, MinValue;
    // find MAX value
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Max = Abc_MaxInt( Max, Entry );
    // count how many times each value appears
    vCounts = Vec_IntStart( Max + 1 );
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    Vec_IntWriteEntry( vCounts, 0, 0 );
    // print out
    if ( fVerbose )
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry )
            printf( "%5d %5d\n", k, Entry );
    // collect first part
    MinValue = ABC_INFINITY;
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry )
            MinValue = Abc_MinInt( MinValue, Entry );
    if ( MinValue == ABC_INFINITY )
        return vRes;
    Min = Vec_IntFind( vCounts, MinValue );
    Vec_IntPush( vResA, Min );
    Vec_IntWriteEntry( vCounts, Min, 0 );
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry == MinValue || Entry == 2*MinValue )
        {
            Vec_IntPush( vResA, k );
            Vec_IntWriteEntry( vCounts, k, 0 );
        }
    // collect second parts
    MinValue = Vec_IntEntry( vCounts, Front );
    Min = Front;
    Vec_IntPush( vResB, Min );
    Vec_IntWriteEntry( vCounts, Min, 0 );
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry == MinValue || Entry == 2*MinValue )
        {
            Vec_IntPush( vResB, k );
            Vec_IntWriteEntry( vCounts, k, 0 );
        }
    Vec_IntFree( vCounts );
    Vec_IntPrint( vResA );
    Vec_IntPrint( vResB );
    // here we need to order the inputs

    // append
    Vec_IntAppend( vRes, vResA );
    Vec_IntAppend( vRes, vResB );
    Vec_IntFree( vResA );
    Vec_IntFree( vResB );
    return vRes;
}